

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint16_linear_BGRA(void *outputp,int width_times_channels,float *encode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  unsigned_short *puVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i i_1;
  __m128 e;
  __m128i tmp1;
  __m128i tmp0;
  __m128i i;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  unsigned_short *end_output;
  unsigned_short *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  puVar14 = (unsigned_short *)((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    output = (unsigned_short *)encode;
    for (end_output = (unsigned_short *)((long)outputp + 8); end_output <= puVar14;
        end_output = end_output + 4) {
      local_1c8 = (float)*(undefined8 *)output;
      fStack_1c4 = (float)((ulong)*(undefined8 *)output >> 0x20);
      fStack_1c0 = (float)*(undefined8 *)(output + 4);
      fStack_1bc = (float)((ulong)*(undefined8 *)(output + 4) >> 0x20);
      uVar1 = CONCAT44(fStack_1c4 + 0.5,fStack_1c0 + 0.5);
      uVar2 = CONCAT44(fStack_1bc + 0.5,local_1c8 + 0.5);
      auVar5._8_8_ = uVar2;
      auVar5._0_8_ = uVar1;
      auVar4._8_8_ = 0x477fff00477fff00;
      auVar4._0_8_ = 0x477fff00477fff00;
      auVar16 = minps(auVar5,auVar4);
      auVar16 = maxps(auVar16,ZEXT816(0));
      local_98 = auVar16._0_4_;
      fStack_94 = auVar16._4_4_;
      fStack_90 = auVar16._8_4_;
      fStack_8c = auVar16._12_4_;
      auVar3._8_8_ = uVar2;
      auVar3._0_8_ = uVar1;
      auVar16._8_8_ = 0x477fff00477fff00;
      auVar16._0_8_ = 0x477fff00477fff00;
      auVar16 = minps(auVar3,auVar16);
      auVar16 = maxps(auVar16,ZEXT816(0));
      local_a8 = auVar16._0_4_;
      fStack_a4 = auVar16._4_4_;
      fStack_a0 = auVar16._8_4_;
      fStack_9c = auVar16._12_4_;
      local_148 = (int)stbir__s32_32768[0];
      iStack_144 = (int)((ulong)stbir__s32_32768[0] >> 0x20);
      iStack_140 = (int)stbir__s32_32768[1];
      iStack_13c = (int)((ulong)stbir__s32_32768[1] >> 0x20);
      auVar11._4_4_ = (int)fStack_94 - iStack_144;
      auVar11._0_4_ = (int)local_98 - local_148;
      auVar11._12_4_ = (int)fStack_8c - iStack_13c;
      auVar11._8_4_ = (int)fStack_90 - iStack_140;
      auVar10._4_4_ = (int)fStack_a4 - iStack_144;
      auVar10._0_4_ = (int)local_a8 - local_148;
      auVar10._12_4_ = (int)fStack_9c - iStack_13c;
      auVar10._8_4_ = (int)fStack_a0 - iStack_140;
      auVar16 = packssdw(auVar11,auVar10);
      local_38 = auVar16._0_2_;
      sStack_36 = auVar16._2_2_;
      sStack_34 = auVar16._4_2_;
      sStack_32 = auVar16._6_2_;
      local_48 = (short)stbir__s16_32768[0];
      sStack_46 = (short)((ulong)stbir__s16_32768[0] >> 0x10);
      sStack_44 = (short)((ulong)stbir__s16_32768[0] >> 0x20);
      sStack_42 = (short)((ulong)stbir__s16_32768[0] >> 0x30);
      tmp0_1[1] = CONCAT26(sStack_32 - sStack_42,
                           CONCAT24(sStack_34 - sStack_44,
                                    CONCAT22(sStack_36 - sStack_46,local_38 - local_48)));
      *(longlong *)(end_output + -4) = tmp0_1[1];
      output = output + 8;
    }
  }
  else {
    end_output = (unsigned_short *)outputp;
    output = (unsigned_short *)encode;
    do {
      do {
        local_188 = (float)*(undefined8 *)output;
        fStack_184 = (float)((ulong)*(undefined8 *)output >> 0x20);
        fStack_180 = (float)*(undefined8 *)(output + 4);
        fStack_17c = (float)((ulong)*(undefined8 *)(output + 4) >> 0x20);
        local_1a8 = (float)*(undefined8 *)(output + 8);
        fStack_1a4 = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        fStack_1a0 = (float)*(undefined8 *)(output + 0xc);
        fStack_19c = (float)((ulong)*(undefined8 *)(output + 0xc) >> 0x20);
        auVar9._4_4_ = fStack_184 + 0.5;
        auVar9._0_4_ = fStack_180 + 0.5;
        auVar9._12_4_ = fStack_17c + 0.5;
        auVar9._8_4_ = local_188 + 0.5;
        auVar7._4_4_ = fStack_1a4 + 0.5;
        auVar7._0_4_ = fStack_1a0 + 0.5;
        auVar7._12_4_ = fStack_19c + 0.5;
        auVar7._8_4_ = local_1a8 + 0.5;
        auVar8._8_8_ = 0x477fff00477fff00;
        auVar8._0_8_ = 0x477fff00477fff00;
        auVar16 = minps(auVar9,auVar8);
        auVar16 = maxps(auVar16,ZEXT816(0));
        local_78 = auVar16._0_4_;
        fStack_74 = auVar16._4_4_;
        fStack_70 = auVar16._8_4_;
        fStack_6c = auVar16._12_4_;
        auVar6._8_8_ = 0x477fff00477fff00;
        auVar6._0_8_ = 0x477fff00477fff00;
        auVar16 = minps(auVar7,auVar6);
        auVar16 = maxps(auVar16,ZEXT816(0));
        local_88 = auVar16._0_4_;
        fStack_84 = auVar16._4_4_;
        fStack_80 = auVar16._8_4_;
        fStack_7c = auVar16._12_4_;
        local_108 = (int)stbir__s32_32768[0];
        iStack_104 = (int)((ulong)stbir__s32_32768[0] >> 0x20);
        iStack_100 = (int)stbir__s32_32768[1];
        iStack_fc = (int)((ulong)stbir__s32_32768[1] >> 0x20);
        auVar13._4_4_ = (int)fStack_74 - iStack_104;
        auVar13._0_4_ = (int)local_78 - local_108;
        auVar13._12_4_ = (int)fStack_6c - iStack_fc;
        auVar13._8_4_ = (int)fStack_70 - iStack_100;
        auVar12._4_4_ = (int)fStack_84 - iStack_104;
        auVar12._0_4_ = (int)local_88 - local_108;
        auVar12._12_4_ = (int)fStack_7c - iStack_fc;
        auVar12._8_4_ = (int)fStack_80 - iStack_100;
        auVar16 = packssdw(auVar13,auVar12);
        local_18 = auVar16._0_2_;
        sStack_16 = auVar16._2_2_;
        sStack_14 = auVar16._4_2_;
        sStack_12 = auVar16._6_2_;
        sStack_10 = auVar16._8_2_;
        sStack_e = auVar16._10_2_;
        sStack_c = auVar16._12_2_;
        sStack_a = auVar16._14_2_;
        local_28 = (short)stbir__s16_32768[0];
        sStack_26 = (short)((ulong)stbir__s16_32768[0] >> 0x10);
        sStack_24 = (short)((ulong)stbir__s16_32768[0] >> 0x20);
        sStack_22 = (short)((ulong)stbir__s16_32768[0] >> 0x30);
        sStack_20 = (short)stbir__s16_32768[1];
        sStack_1e = (short)((ulong)stbir__s16_32768[1] >> 0x10);
        sStack_1c = (short)((ulong)stbir__s16_32768[1] >> 0x20);
        sStack_1a = (short)((ulong)stbir__s16_32768[1] >> 0x30);
        tmp0[1] = CONCAT26(sStack_12 - sStack_22,
                           CONCAT24(sStack_14 - sStack_24,
                                    CONCAT22(sStack_16 - sStack_26,local_18 - local_28)));
        i[0]._0_2_ = sStack_10 - sStack_20;
        i[0]._2_2_ = sStack_e - sStack_1e;
        i[0]._4_2_ = sStack_c - sStack_1c;
        i[0]._6_2_ = sStack_a - sStack_1a;
        *(longlong *)end_output = tmp0[1];
        *(longlong *)(end_output + 4) = i[0];
        output = output + 0x10;
        end_output = end_output + 8;
      } while (end_output <= puVar14 + -8);
      bVar15 = end_output != puVar14;
      end_output = puVar14 + -8;
      output = (unsigned_short *)(encode + (long)width_times_channels + -8);
    } while (bVar15);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_add_mem( e0, STBIR_simd_point5X, encode );
        stbir__simdfX_add_mem( e1, STBIR_simd_point5X, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output; // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_add( e, STBIR__CONSTF(STBIR_simd_point5), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if  stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}